

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_ncode(compiler_state_t *cstate,char *s,bpf_u_int32 v,qual q)

{
  int iVar1;
  block *b1;
  block *b0;
  bpf_u_int32 mask;
  uint dir;
  char *fmt;
  uint type;
  byte bVar2;
  uint uVar3;
  uint proto;
  bpf_u_int32 local_34;
  
  uVar3 = (uint)q >> 8;
  proto = uVar3 & 0xff;
  local_34 = v;
  if (s == (char *)0x0) {
    iVar1 = 0;
  }
  else if (proto == 0xc) {
    iVar1 = __pcap_atodn(s,&local_34);
    if (iVar1 == 0) {
      bpf_error(cstate,"malformed decnet address \'%s\'",s);
    }
  }
  else {
    iVar1 = __pcap_atoin(s,&local_34);
  }
  type = (uint)q & 0xff;
  if (7 < q.addr) {
    if (type != 0xff) {
      abort();
    }
    fmt = "syntax error in filter expression";
LAB_0010e83e:
    bpf_error(cstate,fmt);
  }
  dir = (uint)q >> 0x10 & 0xff;
  bVar2 = q.proto;
  switch(type) {
  default:
    if (bVar2 == 0xc) {
      b1 = gen_dnhostop(cstate,local_34,dir);
    }
    else {
      if ((uVar3 & 0xff) == 1) {
        fmt = "illegal link layer address";
        goto LAB_0010e83e;
      }
      if (type == 2 && s == (char *)0x0) {
        mask = 0xffffffff;
        for (; local_34 - 1 < 0xffffff; local_34 = local_34 * 0x100) {
          mask = mask << 8;
        }
      }
      else {
        local_34 = local_34 << (-(char)iVar1 & 0x1fU);
        mask = -1 << (-(char)iVar1 & 0x1fU);
      }
      b1 = gen_host(cstate,local_34,mask,proto,dir,type);
    }
    break;
  case 3:
    if ((7 < bVar2) || ((0xe1U >> (uVar3 & 0x1f) & 1) == 0)) {
      fmt = "illegal qualifier of \'port\'";
      goto LAB_0010e83e;
    }
    if (0xffff < local_34) {
LAB_0010e80b:
      bpf_error(cstate,"illegal port number %u > 65535");
    }
    iVar1 = *(int *)(&DAT_001218fc + (ulong)(uVar3 & 7) * 4);
    b1 = gen_port(cstate,local_34,iVar1,dir);
    b0 = gen_port6(cstate,local_34,iVar1,dir);
    goto LAB_0010e7b4;
  case 4:
    fmt = "\'gateway\' requires a name";
    goto LAB_0010e83e;
  case 5:
    b1 = gen_proto(cstate,local_34,proto,dir);
    break;
  case 6:
    b1 = gen_protochain(cstate,local_34,proto,0x11fc44);
    break;
  case 7:
    if ((7 < bVar2) || ((0xe1U >> (uVar3 & 0x1f) & 1) == 0)) {
      fmt = "illegal qualifier of \'portrange\'";
      goto LAB_0010e83e;
    }
    if (0xffff < local_34) goto LAB_0010e80b;
    iVar1 = *(int *)(&DAT_001218fc + (ulong)(uVar3 & 7) * 4);
    b1 = gen_portrange(cstate,local_34,local_34,iVar1,dir);
    b0 = gen_portrange6(cstate,local_34,local_34,iVar1,dir);
LAB_0010e7b4:
    gen_or(b0,b1);
  }
  return b1;
}

Assistant:

struct block *
gen_ncode(compiler_state_t *cstate, const char *s, bpf_u_int32 v, struct qual q)
{
	bpf_u_int32 mask;
	int proto = q.proto;
	int dir = q.dir;
	register int vlen;

	if (s == NULL)
		vlen = 32;
	else if (q.proto == Q_DECNET) {
		vlen = __pcap_atodn(s, &v);
		if (vlen == 0)
			bpf_error(cstate, "malformed decnet address '%s'", s);
	} else
		vlen = __pcap_atoin(s, &v);

	switch (q.addr) {

	case Q_DEFAULT:
	case Q_HOST:
	case Q_NET:
		if (proto == Q_DECNET)
			return gen_host(cstate, v, 0, proto, dir, q.addr);
		else if (proto == Q_LINK) {
			bpf_error(cstate, "illegal link layer address");
		} else {
			mask = 0xffffffff;
			if (s == NULL && q.addr == Q_NET) {
				/* Promote short net number */
				while (v && (v & 0xff000000) == 0) {
					v <<= 8;
					mask <<= 8;
				}
			} else {
				/* Promote short ipaddr */
				v <<= 32 - vlen;
				mask <<= 32 - vlen ;
			}
			return gen_host(cstate, v, mask, proto, dir, q.addr);
		}

	case Q_PORT:
		if (proto == Q_UDP)
			proto = IPPROTO_UDP;
		else if (proto == Q_TCP)
			proto = IPPROTO_TCP;
		else if (proto == Q_SCTP)
			proto = IPPROTO_SCTP;
		else if (proto == Q_DEFAULT)
			proto = PROTO_UNDEF;
		else
			bpf_error(cstate, "illegal qualifier of 'port'");

		if (v > 65535)
			bpf_error(cstate, "illegal port number %u > 65535", v);

	    {
		struct block *b;
		b = gen_port(cstate, (int)v, proto, dir);
		gen_or(gen_port6(cstate, (int)v, proto, dir), b);
		return b;
	    }

	case Q_PORTRANGE:
		if (proto == Q_UDP)
			proto = IPPROTO_UDP;
		else if (proto == Q_TCP)
			proto = IPPROTO_TCP;
		else if (proto == Q_SCTP)
			proto = IPPROTO_SCTP;
		else if (proto == Q_DEFAULT)
			proto = PROTO_UNDEF;
		else
			bpf_error(cstate, "illegal qualifier of 'portrange'");

		if (v > 65535)
			bpf_error(cstate, "illegal port number %u > 65535", v);

	    {
		struct block *b;
		b = gen_portrange(cstate, (int)v, (int)v, proto, dir);
		gen_or(gen_portrange6(cstate, (int)v, (int)v, proto, dir), b);
		return b;
	    }

	case Q_GATEWAY:
		bpf_error(cstate, "'gateway' requires a name");
		/* NOTREACHED */

	case Q_PROTO:
		return gen_proto(cstate, (int)v, proto, dir);

	case Q_PROTOCHAIN:
		return gen_protochain(cstate, (int)v, proto, dir);

	case Q_UNDEF:
		syntax(cstate);
		/* NOTREACHED */

	default:
		abort();
		/* NOTREACHED */
	}
	/* NOTREACHED */
}